

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O3

REStackFrame * __thiscall icu_63::RegexMatcher::resetStack(RegexMatcher *this)

{
  int iVar1;
  UVector64 *this_00;
  UBool UVar2;
  int iVar3;
  int minimumCapacity;
  REStackFrame *pRVar4;
  
  UVector64::removeAllElements(this->fStack);
  this_00 = this->fStack;
  iVar1 = this->fPattern->fFrameSize;
  iVar3 = this_00->count;
  minimumCapacity = iVar3 + iVar1;
  if ((minimumCapacity < 0) || (this_00->capacity < minimumCapacity)) {
    UVar2 = UVector64::expandCapacity(this_00,minimumCapacity,&this->fDeferredStatus);
    if (UVar2 == '\0') {
      pRVar4 = (REStackFrame *)0x0;
      goto LAB_0023f1ce;
    }
    iVar3 = this_00->count;
    minimumCapacity = iVar1 + iVar3;
  }
  pRVar4 = (REStackFrame *)(this_00->elements + iVar3);
  this_00->count = minimumCapacity;
LAB_0023f1ce:
  if (this->fDeferredStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar1 = this->fPattern->fFrameSize;
    if (2 < iVar1) {
      memset(pRVar4->fExtra,0xff,(ulong)(iVar1 - 2) << 3);
    }
  }
  else {
    pRVar4 = (REStackFrame *)0x0;
  }
  return pRVar4;
}

Assistant:

REStackFrame *RegexMatcher::resetStack() {
    // Discard any previous contents of the state save stack, and initialize a
    //  new stack frame with all -1 data.  The -1s are needed for capture group limits,
    //  where they indicate that a group has not yet matched anything.
    fStack->removeAllElements();

    REStackFrame *iFrame = (REStackFrame *)fStack->reserveBlock(fPattern->fFrameSize, fDeferredStatus);
    if(U_FAILURE(fDeferredStatus)) {
        return NULL;
    }

    int32_t i;
    for (i=0; i<fPattern->fFrameSize-RESTACKFRAME_HDRCOUNT; i++) {
        iFrame->fExtra[i] = -1;
    }
    return iFrame;
}